

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O0

Reals __thiscall
Omega_h::measure_ents_real_tmpl<2,1>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *coords)

{
  LO size_in;
  char *file;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_1a8;
  undefined1 local_198 [8];
  type f;
  string local_150 [32];
  undefined1 local_130 [8];
  Write<double> sizes;
  undefined1 local_118 [4];
  LO na;
  LOs ev2v;
  RealSimplexSizes measurer;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [39];
  ScopedTimer local_49;
  element_type *peStack_48;
  ScopedTimer omega_h_scoped_function_timer;
  Reals *coords_local;
  LOs *a2e_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  peStack_48 = (element_type *)coords;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
             ,(allocator *)&stack0xffffffffffffff4f);
  std::operator+(local_90,(char *)local_b0);
  std::__cxx11::to_string((__cxx11 *)&measurer.coords.write_.shared_alloc_.direct_ptr,0x35);
  std::operator+(local_70,local_90);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_49,"measure_ents_real_tmpl",file);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)&measurer.coords.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  Read<double>::Read((Read<double> *)&ev2v.write_.shared_alloc_.direct_ptr,coords);
  RealSimplexSizes::RealSimplexSizes
            ((RealSimplexSizes *)&stack0xffffffffffffff08,
             (Reals *)&ev2v.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&ev2v.write_.shared_alloc_.direct_ptr);
  Mesh::ask_verts_of((Mesh *)local_118,(Int)mesh);
  if (((ulong)(a2e->write_).shared_alloc_.alloc & 1) == 0) {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((a2e->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((ulong)(a2e->write_).shared_alloc_.alloc >> 3);
  }
  size_in = (LO)((ulong)local_10._M_pi >> 2);
  sizes.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,"",
             (allocator *)((long)&f.measurer.coords.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_130,size_in,(string *)local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.measurer.coords.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_198,a2e);
  Read<int>::Read((Read<int> *)&f.a2e.write_.shared_alloc_.direct_ptr,(Read<int> *)local_118);
  Write<double>::Write
            ((Write<double> *)&f.ev2v.write_.shared_alloc_.direct_ptr,(Write<double> *)local_130);
  RealSimplexSizes::RealSimplexSizes
            ((RealSimplexSizes *)&f.sizes.shared_alloc_.direct_ptr,
             (RealSimplexSizes *)&stack0xffffffffffffff08);
  parallel_for<Omega_h::measure_ents_real_tmpl<2,1>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (sizes.shared_alloc_.direct_ptr._4_4_,(type *)local_198,"measure_ents_real");
  Write<double>::Write(&local_1a8,(Write<signed_char> *)local_130);
  Read<double>::Read((Read<double> *)this,&local_1a8);
  Write<double>::~Write(&local_1a8);
  measure_ents_real_tmpl<2,1>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_198);
  Write<double>::~Write((Write<double> *)local_130);
  Read<int>::~Read((Read<int> *)local_118);
  RealSimplexSizes::~RealSimplexSizes((RealSimplexSizes *)&stack0xffffffffffffff08);
  ScopedTimer::~ScopedTimer(&local_49);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals measure_ents_real_tmpl(Mesh* mesh, LOs a2e, Reals coords) {
  OMEGA_H_TIME_FUNCTION;
  RealSimplexSizes measurer(coords);
  auto ev2v = mesh->ask_verts_of(edim);
  auto na = a2e.size();
  Write<Real> sizes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<edim + 1>(ev2v, e);
    sizes[a] = measurer.measure<sdim, edim>(v);
  };
  parallel_for(na, f, "measure_ents_real");
  return sizes;
}